

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O1

void __thiscall BibIndexer::lintEntry(BibIndexer *this,TSNode *entryNode)

{
  unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *this_00;
  ushort *puVar1;
  bool bVar2;
  uint32_t childCount;
  const_iterator cVar3;
  long *plVar4;
  undefined8 *puVar5;
  void ***pppvVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  _Alloc_hider _Var10;
  __hashtable *__h;
  bool bVar11;
  optional<Style::Entry_*> oVar12;
  uint32_t i;
  u16string entryKey;
  TSNode keyNode;
  u16string entryName;
  TSNode entryNameNode;
  __node_gen_type __node_gen;
  uint32_t local_fc;
  string local_f8;
  u16string local_d8;
  TSNode local_b8;
  u16string local_98;
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  local_78;
  TSNode local_58;
  unordered_set<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *local_38;
  
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = L'\0';
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  childCount = ts_node_named_child_count(*entryNode);
  local_fc = 0;
  bVar2 = getEntryName(this,&local_98,entryNode,&local_fc,childCount);
  if (!bVar2) goto LAB_0018bb49;
  if (local_98._M_string_length == 0) {
    ts_node_child(&local_58,*entryNode,0);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"No entry name","");
    addLint(this,&local_58,Error,3,(string *)&local_d8);
    local_f8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
    _Var10._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0018bb49;
LAB_0018b9af:
    uVar8 = local_f8.field_2._M_allocated_capacity + 1;
  }
  else {
    oVar12 = Style::Style::getEntry(this->style,&local_98);
    ts_node_named_child(&local_58,*entryNode,local_fc);
    if (((undefined1  [16])
         oVar12.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
         super__Optional_payload_base<Style::Entry_*> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      UtfHandler::utf16to8(&local_f8,&this->utf,&local_98);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x1f2499);
      pppvVar6 = (void ***)(plVar4 + 2);
      if ((void ***)*plVar4 == pppvVar6) {
        local_b8.id = *pppvVar6;
        local_b8.tree = (TSTree *)plVar4[3];
        local_b8.context._0_8_ = &local_b8.id;
      }
      else {
        local_b8.id = *pppvVar6;
        local_b8.context._0_8_ = (void ***)*plVar4;
      }
      local_b8.context._8_8_ = plVar4[1];
      *plVar4 = (long)pppvVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      puVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)puVar7) {
        local_d8.field_2._M_allocated_capacity = *puVar7;
        local_d8.field_2._8_8_ = puVar5[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *puVar7;
        local_d8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_d8._M_string_length = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      addLint(this,&local_58,Warning,0,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((void **)local_b8.context._0_8_ != &local_b8.id) {
        operator_delete((void *)local_b8.context._0_8_,(long)local_b8.id + 1);
      }
      _Var10._M_p = (pointer)local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0018bb49;
      goto LAB_0018b9af;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity =
         local_d8.field_2._M_allocated_capacity & 0xffffffffffff0000;
    bVar2 = getEntryKey(this,&local_d8,entryNode,&local_fc,childCount);
    if (bVar2) {
      ts_node_named_child(&local_b8,*entryNode,local_fc);
      if (local_d8._M_string_length == 0) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Key is empty","");
        addLint(this,&local_58,Warning,2,&local_f8);
LAB_0018b9f8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar8 = local_f8.field_2._M_allocated_capacity + 1;
LAB_0018ba61:
          operator_delete(local_f8._M_dataplus._M_p,uVar8);
        }
      }
      else {
        this_00 = &this->keys;
        cVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(&this_00->_M_h,&local_d8);
        if (cVar3.
            super__Node_iterator_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,"Duplicate key name","");
          addLint(this,&local_b8,Warning,1,&local_f8);
          goto LAB_0018b9f8;
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::u16string::_M_construct<char16_t*>
                  ((u16string *)&local_f8,local_d8._M_dataplus._M_p,
                   local_d8._M_dataplus._M_p + local_d8._M_string_length);
        local_38 = this_00;
        std::
        _Hashtable<std::__cxx11::u16string,std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>,std::__detail::_Identity,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::u16string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::u16string,true>>>>
                  ((_Hashtable<std::__cxx11::u16string,std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>,std::__detail::_Identity,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar8 = local_f8.field_2._M_allocated_capacity * 2 + 2;
          goto LAB_0018ba61;
        }
      }
      bVar2 = local_d8._M_string_length != 0;
      if ((bVar2) && ((ushort)*local_d8._M_dataplus._M_p < 0x7b)) {
        lVar9 = 2;
        do {
          bVar11 = local_d8._M_string_length * 2 == lVar9;
          bVar2 = !bVar11;
          if (bVar11) break;
          puVar1 = (ushort *)((long)local_d8._M_dataplus._M_p + lVar9);
          lVar9 = lVar9 + 2;
        } while (*puVar1 < 0x7b);
      }
      if (bVar2) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"Non ASCII characters detected in key","");
        addLint(this,&local_b8,Warning,3,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      lintFields(this,entryNode,&local_78,&local_fc,childCount);
      postProcessEntry(this,&local_58,
                       oVar12.super__Optional_base<Style::Entry_*,_true,_true>._M_payload.
                       super__Optional_payload_base<Style::Entry_*>._M_payload._M_value,&local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0018bb49;
    uVar8 = local_d8.field_2._M_allocated_capacity * 2 + 2;
    _Var10._M_p = local_d8._M_dataplus._M_p;
  }
  operator_delete(_Var10._M_p,uVar8);
LAB_0018bb49:
  std::
  vector<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>,_std::allocator<std::pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_TSNode>_>_>
  ::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT62(local_98.field_2._M_allocated_capacity._2_6_,
                             local_98.field_2._M_local_buf[0]) * 2 + 2);
  }
  return;
}

Assistant:

void BibIndexer::lintEntry (TSNode &entryNode) {
    // TODO: Work out exactly how much gets linted
    //   when missing things such as entry name, key, etc
    //   (currently we give up as soon as one doesn't exist)

    u16string entryName {};

    vector<std::pair<u16string, TSNode>> observedFields {}; // we're likely to have at most 10, so a vector should be better than a map

    uint32_t childCount = ts_node_named_child_count(entryNode);
    uint32_t i = 0;

    bool foundEntryName = getEntryName(entryName, entryNode, i, childCount);
    if (!foundEntryName) return;

    if (entryName.empty()) {
        TSNode entryNameNode = ts_node_child(entryNode, 0);
        addError(entryNameNode, Error::MissingEntryName, "No entry name");
        return;
    }

    std::optional<Style::Entry *> oentry = style->getEntry(entryName);

    TSNode entryNameNode = ts_node_named_child(entryNode, i);

    if (!oentry) {
        addWarning(entryNameNode, Warning::UnknownEntry, "Entry " + utf.utf16to8(entryName) + " is unexpected");
        return;
    }

    Style::Entry &entry = *oentry.value();

    u16string entryKey;
    bool foundEntryKey = getEntryKey(entryKey, entryNode, i, childCount);
    if (!foundEntryKey) return;

    TSNode keyNode = ts_node_named_child(entryNode, i);

    if (entryKey.empty()) {
        addWarning(entryNameNode, Warning::EmptyKey, "Key is empty");
    } else {
        if (keys.count(entryKey) > 0) {
            addWarning(keyNode, Warning::DuplicateKey, "Duplicate key name");
        } else {
            keys.insert({ entryKey });
        }
    }

    if (hasNonASCIIchar(entryKey)) {
        addWarning(keyNode, Warning::NonASCIIKey, "Non ASCII characters detected in key");
    }

    lintFields(entryNode, observedFields, i, childCount);

    if (oentry) {
        postProcessEntry(entryNameNode, entry, observedFields);
    }
}